

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscSymbolTable.h
# Opt level: O2

void __thiscall CNscSymbolTable::CopyFrom(CNscSymbolTable *this,CNscSymbolTable *pTable)

{
  this->m_nSize = 0;
  MakeRoom(this,pTable->m_nSize);
  memcpy(this->m_pauchData,pTable->m_pauchData,pTable->m_nSize);
  memcpy(&this->m_sFence,&pTable->m_sFence,0x238);
  this->m_nSize = pTable->m_nSize;
  this->m_nGlobalIdentifierCount = pTable->m_nGlobalIdentifierCount;
  return;
}

Assistant:

void CopyFrom (CNscSymbolTable *pTable)
	{
		m_nSize = 0;
		MakeRoom (pTable ->m_nSize);
		memcpy (m_pauchData, pTable ->m_pauchData, pTable ->m_nSize);
		memcpy (&m_sFence, &pTable ->m_sFence, sizeof (m_sFence));
		m_nSize = pTable ->m_nSize;
		m_nGlobalIdentifierCount = pTable ->m_nGlobalIdentifierCount;
	}